

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::~IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x839a48;
  *(undefined8 *)&this->field_0x38 = 0x839b60;
  *(undefined8 *)&this[-1].field_0xd8 = 0x839a70;
  *(undefined8 *)&this[-1].field_0xe8 = 0x839a98;
  *(undefined8 *)&this[-1].field_0x120 = 0x839ac0;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x839ae8;
  *(undefined8 *)&this[-1].field_0x188 = 0x839b10;
  *(undefined8 *)this = 0x839b38;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__00839b80);
  operator_delete(&this[-1].field_0x50,0x198);
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}